

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::discard_undo(CVmObjGramProd *this,CVmUndoRecord *undo_rec)

{
  long in_RSI;
  vmgram_undo_rec *rec;
  vmgram_undo_rec *this_00;
  
  if ((*(long *)(in_RSI + 8) != 0) &&
     (this_00 = *(vmgram_undo_rec **)(in_RSI + 8), this_00 != (vmgram_undo_rec *)0x0)) {
    vmgram_undo_rec::~vmgram_undo_rec(this_00);
    operator_delete(this_00,0x10);
  }
  return;
}

Assistant:

void CVmObjGramProd::discard_undo(VMG_ CVmUndoRecord *undo_rec)
{
    /* check for our private record type */
    if (undo_rec->id.ptrval != 0)
    {
        /* get our private undo record, properly cast */
        vmgram_undo_rec *rec = (vmgram_undo_rec *)undo_rec->id.ptrval;

        /* delete it */
        delete rec;
    }
}